

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void sysbvm_heap_sweep(sysbvm_heap_t *heap)

{
  sysbvm_heap_t *heap_local;
  
  sysbvm_heap_performSweep(heap);
  sysbvm_heap_computeNextCollectionThreshold(heap);
  return;
}

Assistant:

void sysbvm_heap_sweep(sysbvm_heap_t *heap)
{
    sysbvm_heap_performSweep(heap);
    sysbvm_heap_computeNextCollectionThreshold(heap);
}